

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dokick.c
# Opt level: O0

boolean ghitm(monst *mtmp,obj *gold)

{
  uint uVar1;
  bool bVar2;
  boolean bVar3;
  byte bVar4;
  schar sVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  undefined4 uVar13;
  long local_40;
  long goldreqd;
  long robbed;
  long value;
  boolean msg_given;
  obj *gold_local;
  monst *mtmp_local;
  
  bVar2 = false;
  if ((((mtmp->data == mons + 0xdb) && ((*(uint *)&mtmp->field_0x60 >> 8 & 1) == 0)) &&
      (6 < mtmp->mhp)) &&
     (((objects[gold->otyp].oc_oprop != '\x04' && (bVar3 = obj_resists(gold,5,0x32), bVar3 == '\0'))
      && (bVar3 = is_quest_artifact(gold), bVar3 == '\0')))) {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
      pcVar9 = xname(gold);
      pcVar10 = xname(gold);
      pcVar10 = vtense(pcVar10,"disintegrate");
      pline("The %s %s!",pcVar9,pcVar10);
    }
    dealloc_obj(gold);
    return '\x01';
  }
  if ((((mtmp->data->mflags2 & 0x10000000) == 0) && ((*(uint *)&mtmp->field_0x60 >> 0x19 & 1) == 0))
     && (((*(uint *)&mtmp->field_0x60 >> 0x1c & 1) == 0 && ((mtmp->data->mflags2 & 0x400) == 0)))) {
    wakeup(mtmp);
    goto LAB_0019ed5f;
  }
  if ((*(uint *)&mtmp->field_0x60 >> 0x12 & 1) != 0) {
    iVar6 = gold->quan * (int)objects[gold->otyp].oc_cost;
    *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfff7ffff;
    mtmp->meating = 0;
    iVar7 = rn2(4);
    if (iVar7 == 0) {
      setmangry(mtmp);
    }
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
      pcVar9 = Monnam(mtmp);
      pline("%s catches the gold.",pcVar9);
    }
    if ((*(uint *)&mtmp->field_0x60 >> 0x19 & 1) == 0) {
      if ((*(uint *)&mtmp->field_0x60 >> 0x1c & 1) == 0) {
        if ((mtmp->data->mflags2 & 0x400) != 0) {
          local_40 = 0;
          iVar7 = rn2(3);
          if (iVar7 != 0) {
            if (mtmp->data == mons + 0x121) {
              local_40 = 100;
            }
            else if (mtmp->data == mons + 0x122) {
              local_40 = 0xfa;
            }
            else if (mtmp->data == mons + 0x123) {
              local_40 = 500;
            }
            else if (mtmp->data == mons + 0x124) {
              local_40 = 0x2ee;
            }
            else if (mtmp->data == mons + 0x10d) {
              local_40 = 200;
            }
            if (local_40 != 0) {
              lVar12 = money_cnt(invent);
              iVar7 = u.ulevel;
              iVar8 = rn2(5);
              sVar5 = acurr(5);
              if (local_40 + (lVar12 + iVar7 * iVar8) / (long)sVar5 < (long)iVar6) {
                *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffbfffff | 0x400000;
              }
            }
          }
          if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
            verbalize("That\'s not enough, coward!");
          }
          else {
            verbalize("That should do.  Now beat it!");
          }
        }
      }
      else if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
        verbalize("Thanks, scum!");
      }
      else {
        verbalize("Thank you for your contribution.");
      }
    }
    else {
      iVar7._0_1_ = mtmp[0x1b].mtame;
      iVar7._1_1_ = mtmp[0x1b].m_ap_type;
      iVar7._2_1_ = mtmp[0x1b].mfrozen;
      iVar7._3_1_ = mtmp[0x1b].mblinded;
      if ((long)iVar7 == 0) {
        if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
          verbalize("Thanks, scum!");
        }
        else {
          mtmp[0x1b].mappearance = mtmp[0x1b].mappearance + iVar6;
          uVar1 = mtmp[0x1b].mappearance;
          pcVar9 = currency((long)(int)mtmp[0x1b].mappearance);
          pline("You have %ld %s in credit.",(ulong)uVar1,pcVar9);
        }
      }
      else {
        goldreqd = (long)iVar7 - (long)iVar6;
        if (goldreqd < 0) {
          goldreqd = 0;
        }
        pcVar9 = "partially ";
        if (goldreqd == 0) {
          pcVar9 = "";
        }
        iVar6 = pronoun_gender(level,mtmp);
        pline("The amount %scovers %s recent losses.",pcVar9,genders[iVar6].his);
        uVar13 = (undefined4)goldreqd;
        mtmp[0x1b].mtame = (char)uVar13;
        mtmp[0x1b].m_ap_type = (char)((uint)uVar13 >> 8);
        mtmp[0x1b].mfrozen = (char)((uint)uVar13 >> 0x10);
        mtmp[0x1b].mblinded = (char)((uint)uVar13 >> 0x18);
        if (goldreqd == 0) {
          make_happy_shk(mtmp,'\0');
        }
      }
    }
    add_to_minv(mtmp,gold);
    return '\x01';
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if (((((u.uprops[0x1e].intrinsic != 0) ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
           ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
          ((u.uprops[0x40].intrinsic == 0 &&
           ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0)))))) ||
         ((mtmp->data->mflags3 & 0x200) == 0)) goto LAB_0019ed5f;
      bVar4 = viz_array[mtmp->my][mtmp->mx] & 1;
      goto joined_r0x0019e872;
    }
  }
  else {
    bVar4 = worm_known(level,mtmp);
joined_r0x0019e872:
    if (bVar4 == 0) goto LAB_0019ed5f;
  }
  if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
       (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
     ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 && ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0))
      && (((byte)u._1052_1_ >> 5 & 1) == 0)))) {
    pcVar9 = xname(gold);
    pcVar10 = otense(gold,"hit");
    pcVar11 = mon_nam(mtmp);
    pline("The %s harmlessly %s %s.",pcVar9,pcVar10,pcVar11);
    bVar2 = true;
  }
LAB_0019ed5f:
  if (!bVar2) {
    pcVar9 = xname(gold);
    miss(pcVar9,mtmp);
  }
  return '\0';
}

Assistant:

boolean ghitm(struct monst *mtmp, struct obj *gold)
{
	boolean msg_given = FALSE;

	if (touch_disintegrates(mtmp->data) && !mtmp->mcan && mtmp->mhp > 6 &&
		!oresist_disintegration(gold)) {
	    if (cansee(mtmp->mx, mtmp->my))
		pline("The %s %s!", xname(gold), vtense(xname(gold),"disintegrate"));
	    dealloc_obj(gold);
	    return TRUE;
	}

	if (!likes_gold(mtmp->data) && !mtmp->isshk && !mtmp->ispriest
			&& !is_mercenary(mtmp->data)) {
		wakeup(mtmp);
	} else if (!mtmp->mcanmove) {
		/* too light to do real damage */
		if (canseemon(level, mtmp)) {
		    pline("The %s harmlessly %s %s.", xname(gold),
			      otense(gold, "hit"), mon_nam(mtmp));
		    msg_given = TRUE;
		}
	} else {
                long value = gold->quan * objects[gold->otyp].oc_cost;

		mtmp->msleeping = 0;
		mtmp->meating = 0;
		if (!rn2(4)) setmangry(mtmp); /* not always pleasing */

		/* greedy monsters catch gold */
		if (cansee(mtmp->mx, mtmp->my))
		    pline("%s catches the gold.", Monnam(mtmp));
		if (mtmp->isshk) {
			long robbed = ESHK(mtmp)->robbed;

			if (robbed) {
				robbed -= value;
				if (robbed < 0) robbed = 0;
				pline("The amount %scovers %s recent losses.",
				      !robbed ? "" : "partially ",
				      mhis(level, mtmp));
				ESHK(mtmp)->robbed = robbed;
				if (!robbed)
					make_happy_shk(mtmp, FALSE);
			} else {
				if (mtmp->mpeaceful) {
				    ESHK(mtmp)->credit += value;
				    pline("You have %ld %s in credit.",
					ESHK(mtmp)->credit,
					currency(ESHK(mtmp)->credit));
				} else verbalize("Thanks, scum!");
			}
		} else if (mtmp->ispriest) {
			if (mtmp->mpeaceful)
			    verbalize("Thank you for your contribution.");
			else verbalize("Thanks, scum!");
		} else if (is_mercenary(mtmp->data)) {
		    long goldreqd = 0L;

		    if (rn2(3)) {
			if (mtmp->data == &mons[PM_SOLDIER])
			   goldreqd = 100L;
			else if (mtmp->data == &mons[PM_SERGEANT])
			   goldreqd = 250L;
			else if (mtmp->data == &mons[PM_LIEUTENANT])
			   goldreqd = 500L;
			else if (mtmp->data == &mons[PM_CAPTAIN])
			   goldreqd = 750L;
			else if (mtmp->data == &mons[PM_PRISON_GUARD])
			   goldreqd = 200L;

			if (goldreqd) {
			   if (value > goldreqd +
				(money_cnt(invent) + u.ulevel*rn2(5))/ACURR(A_CHA))
			    mtmp->mpeaceful = TRUE;
			}
		     }
		     if (mtmp->mpeaceful)
			    verbalize("That should do.  Now beat it!");
		     else verbalize("That's not enough, coward!");
		}

		add_to_minv(mtmp, gold);
		return TRUE;
	}

	if (!msg_given) miss(xname(gold), mtmp);
	return FALSE;
}